

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairTools.cpp
# Opt level: O3

uint16_t wirehair::FloorSquareRoot16(uint16_t x)

{
  byte bVar1;
  uint uVar2;
  undefined2 in_register_0000003a;
  uint uVar3;
  
  uVar3 = CONCAT22(in_register_0000003a,x);
  uVar2 = 6;
  if (0xff < x) {
    uVar2 = LZCOUNT(uVar3) ^ 0x1f;
  }
  bVar1 = (byte)kSquareRootTable[uVar3 >> ((ulong)((char)uVar2 - 6U & 0xfe) & 0x3f)] >>
          ((byte)(uVar2 >> 1) ^ 7);
  return (ushort)bVar1 - (ushort)(uVar3 < (uint)bVar1 * (uint)bVar1);
}

Assistant:

uint16_t FloorSquareRoot16(uint16_t x)
{
    unsigned nonzeroBits;
    if (x < 0x100) {
        nonzeroBits = 6;
    }
    else {
        // TBD: It might be faster on ARM to just use branches
        nonzeroBits = Log32(x);
    }

    // See TableGenerator.cpp for logic here
    const unsigned tableShift = (nonzeroBits - 6) & 0xfe;
    const unsigned resultShift = (15 - nonzeroBits) / 2;
    uint16_t r = kSquareRootTable[x >> tableShift] >> resultShift;

    // Correct rounding if necessary (compiler optimizes this form better)
    r -= (r * r > x);

    return r;
}